

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tetrahedralized_Volume_3D.cpp
# Opt level: O0

T_Element * __thiscall
Nova::Tetrahedralized_Volume<float,_3>::Get_Element
          (T_Element *__return_storage_ptr__,Tetrahedralized_Volume<float,_3> *this,int id)

{
  size_t sVar1;
  Vector<int,_4,_true> *this_00;
  int *piVar2;
  Vector<float,_3,_true> *x1;
  Vector<float,_3,_true> *x2;
  Vector<float,_3,_true> *x3;
  Vector<float,_3,_true> *x4;
  bool bVar3;
  INDEX *e;
  int id_local;
  Tetrahedralized_Volume<float,_3> *this_local;
  
  bVar3 = false;
  if (-1 < id) {
    sVar1 = Array<Nova::Vector<int,_4,_true>_>::size(&(this->super_Simplex_Mesh<4>).elements);
    bVar3 = (ulong)(long)id < sVar1;
  }
  if (!bVar3) {
    __assert_fail("id>=0 && id<elements.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Geometry/src/Topology_Based_Geometry/Tetrahedralized_Volume_3D.cpp"
                  ,0x24,
                  "typename Nova::Tetrahedralized_Volume_Policy<T, d>::T_Element Nova::Tetrahedralized_Volume<float, 3>::Get_Element(const int) const [T = float, d = 3]"
                 );
  }
  this_00 = Array<Nova::Vector<int,_4,_true>_>::operator()
                      (&(this->super_Simplex_Mesh<4>).elements,id);
  piVar2 = Vector<int,_4,_true>::operator()(this_00,0);
  x1 = Array<Nova::Vector<float,_3,_true>_>::operator()
                 ((Array<Nova::Vector<float,_3,_true>_> *)this,*piVar2);
  piVar2 = Vector<int,_4,_true>::operator()(this_00,1);
  x2 = Array<Nova::Vector<float,_3,_true>_>::operator()
                 ((Array<Nova::Vector<float,_3,_true>_> *)this,*piVar2);
  piVar2 = Vector<int,_4,_true>::operator()(this_00,2);
  x3 = Array<Nova::Vector<float,_3,_true>_>::operator()
                 ((Array<Nova::Vector<float,_3,_true>_> *)this,*piVar2);
  piVar2 = Vector<int,_4,_true>::operator()(this_00,3);
  x4 = Array<Nova::Vector<float,_3,_true>_>::operator()
                 ((Array<Nova::Vector<float,_3,_true>_> *)this,*piVar2);
  Tetrahedron<float>::Tetrahedron(__return_storage_ptr__,x1,x2,x3,x4);
  return __return_storage_ptr__;
}

Assistant:

typename Nova::Tetrahedralized_Volume_Policy<T,d>::T_Element Nova::Tetrahedralized_Volume<T,d>::
Get_Element(const int id) const
{
    assert(id>=0 && id<elements.size());
    const INDEX& e=elements(id);
    return T_Element(points(e(0)),points(e(1)),points(e(2)),points(e(3)));
}